

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O0

void __thiscall
boost::python::
class_<SpikesConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
::id_vector::id_vector(id_vector *this)

{
  add_pointer<mpl_::arg<_1>_> *paVar1;
  write_type_id f;
  add_pointer<mpl_::arg<_1>_> *in_RDI;
  type_info *p;
  type_info *in_stack_ffffffffffffffb8;
  add_pointer<mpl_::arg<_1>_> *local_28;
  write_type_id local_20;
  add_pointer<mpl_::arg<_1>_> *local_18;
  base_id_t local_10;
  
  f.p = (type_info **)(in_RDI + 0x10);
  paVar1 = in_RDI;
  do {
    local_28 = paVar1;
    type_info::type_info((type_info *)local_28,in_stack_ffffffffffffffb8);
    paVar1 = local_28 + 8;
  } while (local_28 + 8 != (add_pointer<mpl_::arg<_1>_> *)f.p);
  local_10 = (base_id_t)
             detail::unwrap_type_id<SpikesConsumer_python,SpikesConsumer>
                       ((SpikesConsumer_python *)0x0,(wrapper<SpikesConsumer> *)0x3cae1c);
  *(base_id_t *)in_RDI = local_10;
  local_18 = in_RDI + 8;
  detail::write_type_id::write_type_id(&local_20,(type_info **)&local_18);
  mpl::
  for_each<boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::add_pointer<mpl_::arg<_1>>,boost::python::detail::write_type_id>
            (f,(bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
                *)in_RDI,local_28);
  return;
}

Assistant:

id_vector()
        {
            // Stick the derived class id into the first element of the array
            ids[0] = detail::unwrap_type_id((W*)0, (W*)0);

            // Write the rest of the elements into succeeding positions.
            type_info* p = ids + 1;
            mpl::for_each(detail::write_type_id(&p), (bases*)0, (add_pointer<mpl::_>*)0);
        }